

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

int __thiscall AddrManImpl::CheckAddrman(AddrManImpl *this)

{
  key_type *__k;
  unordered_map<CService,_int,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_int>_>_>
  *this_00;
  pointer piVar1;
  string prefix;
  string end_msg;
  bool bVar2;
  Network NVar3;
  uint uVar4;
  uint *puVar5;
  const_iterator cVar6;
  ulong uVar7;
  size_type sVar8;
  __node_base_ptr p_Var9;
  size_type sVar10;
  mapped_type *pmVar11;
  uchar *puVar12;
  mapped_type *pmVar13;
  __node_base *p_Var14;
  ulong uVar15;
  int iVar16;
  int (*paiVar17) [64];
  _Hash_node_base *p_Var18;
  unsigned_long *in_R9;
  AddrManImpl *pAVar19;
  __node_base *p_Var20;
  long in_FS_OFFSET;
  bool bVar21;
  byte bVar22;
  int n;
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  local_counts;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  mapNew;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> setTried;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer2;
  undefined8 in_stack_fffffffffffffe48;
  AddrManImpl *pAVar23;
  undefined8 in_stack_fffffffffffffe50;
  int *piVar24;
  uint256 *nKey;
  undefined1 in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe59;
  undefined8 in_stack_fffffffffffffe60;
  int *args;
  int (*paiVar25) [64];
  undefined8 in_stack_fffffffffffffe68;
  _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  undefined4 in_stack_fffffffffffffe70;
  key_type in_stack_fffffffffffffe74;
  __buckets_ptr in_stack_fffffffffffffe78;
  size_type in_stack_fffffffffffffe80;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_150;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_118;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_e0;
  string local_d8;
  long *local_b8 [2];
  long local_a8 [2];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"CheckAddrman","");
  piVar24 = &this->nNew;
  args = &this->nTried;
  local_118._M_buckets =
       (__buckets_ptr)
       ((long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2);
  tinyformat::format<int,int,unsigned_long>
            (&local_d8,(tinyformat *)"new %i, tried %i, total %u",(char *)piVar24,args,
             (int *)&local_118,in_R9);
  prefix._M_string_length = in_stack_fffffffffffffe50;
  prefix._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  prefix.field_2._M_local_buf[0] = in_stack_fffffffffffffe58;
  prefix.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffffe59;
  prefix.field_2._8_8_ = in_stack_fffffffffffffe60;
  end_msg._M_string_length._0_4_ = in_stack_fffffffffffffe70;
  end_msg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
  end_msg._M_string_length._4_4_ = in_stack_fffffffffffffe74;
  end_msg.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe78;
  end_msg.field_2._8_8_ = in_stack_fffffffffffffe80;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
            (&local_98,prefix,end_msg,(LogFlags)local_b8,SUB81(&local_d8,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  local_118._M_buckets = &local_118._M_single_bucket;
  local_118._M_bucket_count = 1;
  local_118._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_118._M_element_count = 0;
  local_118._M_rehash_policy._M_max_load_factor = 1.0;
  local_118._M_rehash_policy._M_next_resize = 0;
  local_118._M_single_bucket = (__node_base_ptr)0x0;
  local_150._M_buckets = &local_150._M_single_bucket;
  local_150._M_bucket_count = 1;
  local_150._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_150._M_element_count = 0;
  local_150._M_rehash_policy._M_max_load_factor = 1.0;
  local_150._M_rehash_policy._M_next_resize = 0;
  local_150._M_single_bucket = (__node_base_ptr)0x0;
  iVar16 = -7;
  if ((long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start >> 2 == (long)this->nNew + (long)this->nTried) {
    this_01 = &(this->mapInfo)._M_h;
    p_Var20 = &(this->mapInfo)._M_h._M_before_begin;
    this_00 = &this->mapAddr;
    pAVar23 = this;
    do {
      p_Var20 = p_Var20->_M_nxt;
      if (p_Var20 == (__node_base *)0x0) {
        this = (AddrManImpl *)((ulong)this & 0xffffffff);
        break;
      }
      iVar16 = (int)*(size_type *)(p_Var20 + 1);
      __k = (key_type *)(p_Var20 + 2);
      if (*(char *)&p_Var20[0x11]._M_nxt == '\x01') {
        if (p_Var20[0xf]._M_nxt == (_Hash_node_base *)0x0) {
          pAVar19 = (AddrManImpl *)0xffffffff;
          goto LAB_004537ae;
        }
        if (*(int *)((long)&p_Var20[0x10]._M_nxt + 4) != 0) {
          pAVar19 = (AddrManImpl *)0xfffffffe;
          goto LAB_004537ae;
        }
        local_e0 = &local_118;
        std::
        _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                  ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_e0,&stack0xfffffffffffffe74,&local_e0);
        NVar3 = CNetAddr::GetNetwork((CNetAddr *)__k);
        local_e0 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)CONCAT44(local_e0._4_4_,NVar3);
        pmVar13 = std::__detail::
                  _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&stack0xfffffffffffffe78,(key_type *)&local_e0);
        pmVar13->n_tried = pmVar13->n_tried + 1;
LAB_00453738:
        cVar6 = std::
                _Hashtable<CService,_std::pair<const_CService,_int>,_std::allocator<std::pair<const_CService,_int>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_00->_M_h,__k);
        pAVar19 = (AddrManImpl *)0xfffffffb;
        if ((cVar6.super__Node_iterator_base<std::pair<const_CService,_int>,_false>._M_cur ==
             (__node_type *)0x0) ||
           (*(int *)((long)cVar6.super__Node_iterator_base<std::pair<const_CService,_int>,_false>.
                           _M_cur + 0x30) != iVar16)) goto LAB_004537ae;
        uVar7 = (ulong)*(int *)((long)&p_Var20[0x11]._M_nxt + 4);
        pAVar19 = (AddrManImpl *)0xfffffff2;
        if (((long)uVar7 < 0) ||
           ((piVar1 = (pAVar23->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
            (ulong)((long)(pAVar23->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar7 ||
            (piVar1[uVar7] != iVar16)))) goto LAB_004537ae;
        if ((long)p_Var20[9]._M_nxt < 0) {
          pAVar19 = (AddrManImpl *)0xfffffffa;
          goto LAB_004537ae;
        }
        bVar21 = -1 < (long)p_Var20[0xf]._M_nxt;
        uVar4 = (uint)this;
        if (!bVar21) {
          uVar4 = 0xfffffff8;
        }
        this = (AddrManImpl *)(ulong)uVar4;
      }
      else {
        uVar4 = *(uint *)((long)&p_Var20[0x10]._M_nxt + 4);
        if (uVar4 < 9) {
          if (uVar4 != 0) {
            puVar5 = (uint *)std::__detail::
                             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)&local_150,(key_type *)&stack0xfffffffffffffe74);
            *puVar5 = uVar4;
            NVar3 = CNetAddr::GetNetwork((CNetAddr *)__k);
            local_e0 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)CONCAT44(local_e0._4_4_,NVar3);
            pmVar13 = std::__detail::
                      _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&stack0xfffffffffffffe78,(key_type *)&local_e0);
            pmVar13->n_new = pmVar13->n_new + 1;
            goto LAB_00453738;
          }
          pAVar19 = (AddrManImpl *)0xfffffffc;
        }
        else {
          pAVar19 = (AddrManImpl *)0xfffffffd;
        }
LAB_004537ae:
        this = pAVar19;
        bVar21 = false;
      }
    } while (bVar21);
    iVar16 = (int)this;
    if (((p_Var20 == (__node_base *)0x0) && (iVar16 = -9, local_118._M_element_count == (long)*args)
        ) && (iVar16 = -10, local_150._M_element_count == (long)*piVar24)) {
      paiVar17 = pAVar23->vvTried;
      nKey = &pAVar23->nKey;
      uVar7 = 0;
      bVar22 = false;
      do {
        uVar15 = 0;
        bVar21 = false;
        paiVar25 = paiVar17;
        do {
          if ((*paiVar17)[0] != -1) {
            sVar8 = std::
                    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::count(&local_118,*paiVar17);
            if (sVar8 == 0) {
              this = (AddrManImpl *)0xfffffff5;
              break;
            }
            p_Var9 = std::
                     _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::_M_find_before_node
                               (this_01,(ulong)(long)(*paiVar17)[0] %
                                        (pAVar23->mapInfo)._M_h._M_bucket_count,*paiVar17,
                                (long)(*paiVar17)[0]);
            if (p_Var9 == (__node_base_ptr)0x0) {
              p_Var18 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var18 = p_Var9->_M_nxt;
            }
            if (p_Var18 == (_Hash_node_base *)0x0) {
LAB_004538e2:
              bVar2 = false;
              this = (AddrManImpl *)0xffffffef;
            }
            else {
              uVar4 = AddrInfo::GetTriedBucket
                                ((AddrInfo *)(p_Var18 + 2),nKey,pAVar23->m_netgroupman);
              if (uVar7 != uVar4) goto LAB_004538e2;
              uVar4 = AddrInfo::GetBucketPosition((AddrInfo *)(p_Var18 + 2),nKey,false,(int)uVar7);
              if (uVar15 == uVar4) {
                bVar2 = true;
                std::
                _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::_M_erase(&local_118,paiVar17);
              }
              else {
                this = (AddrManImpl *)0xffffffee;
                bVar2 = false;
              }
            }
            if (!bVar2) break;
          }
          bVar21 = 0x3e < uVar15;
          uVar15 = uVar15 + 1;
          paiVar17 = (int (*) [64])(*paiVar17 + 1);
        } while (uVar15 != 0x40);
        iVar16 = (int)this;
        if (!bVar21) break;
        bVar22 = 0xfe < uVar7;
        uVar7 = uVar7 + 1;
        paiVar17 = paiVar25 + 1;
      } while (uVar7 != 0x100);
      if ((bVar22 & 1) != 0) {
        paiVar17 = pAVar23->vvNew;
        uVar7 = 0;
        bVar22 = false;
        do {
          uVar15 = 0;
          bVar21 = false;
          paiVar25 = paiVar17;
          do {
            if ((*paiVar17)[0] != -1) {
              sVar10 = std::
                       _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::count(&local_150,*paiVar17);
              if (sVar10 == 0) {
                this = (AddrManImpl *)0xfffffff4;
                break;
              }
              p_Var9 = std::
                       _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::_M_find_before_node
                                 (this_01,(ulong)(long)(*paiVar17)[0] %
                                          (pAVar23->mapInfo)._M_h._M_bucket_count,*paiVar17,
                                  (long)(*paiVar17)[0]);
              if (p_Var9 == (__node_base_ptr)0x0) {
                p_Var18 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var18 = p_Var9->_M_nxt;
              }
              if ((p_Var18 == (_Hash_node_base *)0x0) ||
                 (uVar4 = AddrInfo::GetBucketPosition
                                    ((AddrInfo *)(p_Var18 + 2),nKey,true,(int)uVar7),
                 uVar15 != uVar4)) {
                bVar2 = false;
                this = (AddrManImpl *)0xffffffed;
              }
              else {
                pmVar11 = std::__detail::
                          _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&local_150,*paiVar17);
                *pmVar11 = *pmVar11 + -1;
                bVar2 = true;
                if (*pmVar11 == 0) {
                  std::
                  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::_M_erase(&local_150,paiVar17);
                }
              }
              if (!bVar2) break;
            }
            bVar21 = 0x3e < uVar15;
            uVar15 = uVar15 + 1;
            paiVar17 = (int (*) [64])(*paiVar17 + 1);
          } while (uVar15 != 0x40);
          iVar16 = (int)this;
          if (!bVar21) break;
          bVar22 = 0x3fe < uVar7;
          uVar7 = uVar7 + 1;
          paiVar17 = paiVar25 + 1;
        } while (uVar7 != 0x400);
        if ((((bVar22 & 1) != 0) && (iVar16 = -0xd, local_118._M_element_count == 0)) &&
           (iVar16 = -0xf, local_150._M_element_count == 0)) {
          piVar24 = &pAVar23->nIdCount;
          puVar12 = std::
                    __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                              (nKey,piVar24);
          if ((int *)puVar12 == piVar24) {
            iVar16 = -0x10;
          }
          else {
            p_Var14 = &(pAVar23->m_network_counts)._M_h._M_before_begin;
            do {
              p_Var14 = p_Var14->_M_nxt;
              if (p_Var14 == (__node_base *)0x0) {
                iVar16 = 0;
                break;
              }
              pmVar13 = std::__detail::
                        _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&stack0xfffffffffffffe78,(key_type *)(p_Var14 + 1));
              if ((_Hash_node_base *)pmVar13->n_new ==
                  *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var14 + 2))->_M_max_load_factor)
              {
                pmVar13 = std::__detail::
                          _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&stack0xfffffffffffffe78,(key_type *)(p_Var14 + 1));
                bVar21 = (_Hash_node_base *)pmVar13->n_tried == p_Var14[3]._M_nxt;
                if (!bVar21) {
                  this = (AddrManImpl *)0xffffffeb;
                }
              }
              else {
                this = (AddrManImpl *)0xffffffeb;
                bVar21 = false;
              }
              iVar16 = (int)this;
            } while (bVar21);
          }
        }
      }
    }
  }
  std::
  _Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&stack0xfffffffffffffe78);
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_150);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_118);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar16;
  }
  __stack_chk_fail();
}

Assistant:

int AddrManImpl::CheckAddrman() const
{
    AssertLockHeld(cs);

    LOG_TIME_MILLIS_WITH_CATEGORY_MSG_ONCE(
        strprintf("new %i, tried %i, total %u", nNew, nTried, vRandom.size()), BCLog::ADDRMAN);

    std::unordered_set<int> setTried;
    std::unordered_map<int, int> mapNew;
    std::unordered_map<Network, NewTriedCount> local_counts;

    if (vRandom.size() != (size_t)(nTried + nNew))
        return -7;

    for (const auto& entry : mapInfo) {
        int n = entry.first;
        const AddrInfo& info = entry.second;
        if (info.fInTried) {
            if (!TicksSinceEpoch<std::chrono::seconds>(info.m_last_success)) {
                return -1;
            }
            if (info.nRefCount)
                return -2;
            setTried.insert(n);
            local_counts[info.GetNetwork()].n_tried++;
        } else {
            if (info.nRefCount < 0 || info.nRefCount > ADDRMAN_NEW_BUCKETS_PER_ADDRESS)
                return -3;
            if (!info.nRefCount)
                return -4;
            mapNew[n] = info.nRefCount;
            local_counts[info.GetNetwork()].n_new++;
        }
        const auto it{mapAddr.find(info)};
        if (it == mapAddr.end() || it->second != n) {
            return -5;
        }
        if (info.nRandomPos < 0 || (size_t)info.nRandomPos >= vRandom.size() || vRandom[info.nRandomPos] != n)
            return -14;
        if (info.m_last_try < NodeSeconds{0s}) {
            return -6;
        }
        if (info.m_last_success < NodeSeconds{0s}) {
            return -8;
        }
    }

    if (setTried.size() != (size_t)nTried)
        return -9;
    if (mapNew.size() != (size_t)nNew)
        return -10;

    for (int n = 0; n < ADDRMAN_TRIED_BUCKET_COUNT; n++) {
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvTried[n][i] != -1) {
                if (!setTried.count(vvTried[n][i]))
                    return -11;
                const auto it{mapInfo.find(vvTried[n][i])};
                if (it == mapInfo.end() || it->second.GetTriedBucket(nKey, m_netgroupman) != n) {
                    return -17;
                }
                if (it->second.GetBucketPosition(nKey, false, n) != i) {
                    return -18;
                }
                setTried.erase(vvTried[n][i]);
            }
        }
    }

    for (int n = 0; n < ADDRMAN_NEW_BUCKET_COUNT; n++) {
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvNew[n][i] != -1) {
                if (!mapNew.count(vvNew[n][i]))
                    return -12;
                const auto it{mapInfo.find(vvNew[n][i])};
                if (it == mapInfo.end() || it->second.GetBucketPosition(nKey, true, n) != i) {
                    return -19;
                }
                if (--mapNew[vvNew[n][i]] == 0)
                    mapNew.erase(vvNew[n][i]);
            }
        }
    }

    if (setTried.size())
        return -13;
    if (mapNew.size())
        return -15;
    if (nKey.IsNull())
        return -16;

    // It's possible that m_network_counts may have all-zero entries that local_counts
    // doesn't have if addrs from a network were being added and then removed again in the past.
    if (m_network_counts.size() < local_counts.size()) {
        return -20;
    }
    for (const auto& [net, count] : m_network_counts) {
        if (local_counts[net].n_new != count.n_new || local_counts[net].n_tried != count.n_tried) {
            return -21;
        }
    }

    return 0;
}